

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O2

int cram_decode_TD(char *cp,cram_block_compression_hdr *h)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  cram_block *b;
  uchar *puVar5;
  uchar **ppuVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  size_t __size;
  size_t sVar11;
  size_t sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  ulong uStack_40;
  int local_38;
  
  b = cram_new_block(FILE_HEADER,0);
  iVar4 = -1;
  if (b != (cram_block *)0x0) {
    h->TD_blk = b;
    bVar2 = *cp;
    uVar3 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      uVar10 = (uint)bVar2;
      uVar3 = (uint)(byte)cp[1];
      if (bVar2 < 0xc0) {
        uVar3 = (uVar10 & 0x3f) << 8 | uVar3;
        uStack_40 = 2;
      }
      else if (bVar2 < 0xe0) {
        uVar3 = (uVar10 & 0x1f) << 0x10 | uVar3 << 8 | (uint)(byte)cp[2];
        uStack_40 = 3;
      }
      else if (bVar2 < 0xf0) {
        uVar3 = (uVar10 & 0xf) << 0x18 | uVar3 << 0x10 | (uint)(byte)cp[2] << 8 | (uint)(byte)cp[3];
        uStack_40 = 4;
      }
      else {
        uVar3 = (byte)cp[4] & 0xf |
                (uint)(byte)cp[3] << 4 | (uint)(byte)cp[2] << 0xc | uVar3 << 0x14 | uVar10 << 0x1c;
        uStack_40 = 5;
      }
    }
    else {
      uStack_40 = 1;
    }
    if (uVar3 == 0) {
      h->nTL = 0;
      h->TL = (uchar **)0x0;
      cram_free_block(b);
    }
    else {
      sVar11 = (size_t)(int)uVar3;
      while( true ) {
        uVar9 = b->alloc;
        if (b->byte + sVar11 < uVar9) break;
        auVar13._8_4_ = (int)(uVar9 >> 0x20);
        auVar13._0_8_ = uVar9;
        auVar13._12_4_ = 0x45300000;
        dVar15 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar15;
        __size = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar9 == 0) {
          __size = 0x400;
        }
        b->alloc = __size;
        puVar5 = (uchar *)realloc(b->data,__size);
        b->data = puVar5;
      }
      memcpy(b->data + b->byte,cp + uStack_40,sVar11);
      sVar12 = sVar11 + b->byte;
      b->byte = sVar12;
      puVar5 = b->data;
      if (puVar5[sVar12 - 1] != '\0') {
        while( true ) {
          uVar9 = b->alloc;
          if (sVar12 + 1 < uVar9) break;
          auVar14._8_4_ = (int)(uVar9 >> 0x20);
          auVar14._0_8_ = uVar9;
          auVar14._12_4_ = 0x45300000;
          dVar15 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 1.5;
          uVar8 = (ulong)dVar15;
          sVar11 = (long)(dVar15 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
          if (uVar9 == 0) {
            sVar11 = 0x400;
          }
          b->alloc = sVar11;
          puVar5 = (uchar *)realloc(puVar5,sVar11);
          b->data = puVar5;
          sVar12 = b->byte;
        }
        b->byte = sVar12 + 1;
        puVar5[sVar12] = '\0';
        puVar5 = b->data;
        sVar12 = b->byte;
      }
      local_38 = (int)cp;
      uStack_40 = (ulong)(((int)(cp + uStack_40) + uVar3) - local_38);
      uVar3 = 0;
      uVar9 = 0;
      while (uVar9 = (ulong)(int)uVar9, uVar9 < sVar12) {
        do {
          puVar1 = puVar5 + uVar9;
          uVar9 = uVar9 + 1;
        } while (*puVar1 != '\0');
        uVar3 = uVar3 + 1;
      }
      h->nTL = uVar3;
      ppuVar6 = (uchar **)calloc((ulong)uVar3,8);
      h->TL = ppuVar6;
      if (ppuVar6 == (uchar **)0x0) {
        return -1;
      }
      lVar7 = 0;
      uVar9 = 0;
      while (uVar9 = (ulong)(int)uVar9, uVar9 < sVar12) {
        h->TL[lVar7] = puVar5 + uVar9;
        do {
          puVar1 = puVar5 + uVar9;
          uVar9 = uVar9 + 1;
        } while (*puVar1 != '\0');
        lVar7 = lVar7 + 1;
      }
    }
    iVar4 = (int)uStack_40;
  }
  return iVar4;
}

Assistant:

int cram_decode_TD(char *cp, cram_block_compression_hdr *h) {
    char *op = cp;
    unsigned char *dat;
    cram_block *b;
    int32_t blk_size;
    int nTL, i, sz;

    if (!(b = cram_new_block(0, 0)))
	return -1;
    h->TD_blk = b;

    /* Decode */
    cp += itf8_get(cp, &blk_size);
    if (!blk_size) {
	h->nTL = 0;
	h->TL = NULL;
	cram_free_block(b);
        return cp - op;
    }

    BLOCK_APPEND(b, cp, blk_size);
    cp += blk_size;
    sz = cp - op;

    // Force nul termination if missing
    if (BLOCK_DATA(b)[BLOCK_SIZE(b)-1])
	BLOCK_APPEND_CHAR(b, '\0');

    /* Set up TL lookup table */
    dat = BLOCK_DATA(b);

    // Count
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	nTL++;
	while (dat[i])
	    i++;
    }

    // Copy
    h->nTL = nTL;
    if (!(h->TL = calloc(h->nTL, sizeof(unsigned char *))))
	return -1;
    for (nTL = i = 0; i < BLOCK_SIZE(b); i++) {
	h->TL[nTL++] = &dat[i];
	while (dat[i])
	    i++;
    }
    
    return sz;
}